

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O1

string * formatFloatNumber(string *__return_storage_ptr__,string *number)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  char *pcVar5;
  pointer pcVar6;
  long lVar7;
  uint uVar8;
  string local_68;
  string local_48;
  
  pcVar2 = (number->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + number->_M_string_length);
  bVar4 = contain(&local_48,'.');
  if (!bVar4) {
    __assert_fail("contain(number, \'.\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/egor-baranov[P]Neko/helpers.hpp"
                  ,0x12d,"string formatFloatNumber(string)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (number->_M_dataplus)._M_p;
  pcVar6 = pcVar2 + (number->_M_string_length - 1);
  if (pcVar2 < pcVar6 && number->_M_string_length != 0) {
    do {
      pcVar5 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar6;
      *pcVar6 = cVar1;
      pcVar6 = pcVar6 + -1;
      pcVar2 = pcVar5;
    } while (pcVar5 < pcVar6);
  }
  sVar3 = number->_M_string_length;
  if (sVar3 == 1) {
    uVar8 = 0xffffffff;
  }
  else {
    pcVar2 = (number->_M_dataplus)._M_p;
    uVar8 = (int)sVar3 - 1;
    lVar7 = 0;
    do {
      if ((pcVar2[lVar7] != '0') || (pcVar2[lVar7 + 1] == '.')) {
        uVar8 = (uint)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (sVar3 - 1 != lVar7);
    uVar8 = ~uVar8;
  }
  pcVar2 = (number->_M_dataplus)._M_p;
  pcVar6 = pcVar2 + (sVar3 - 1);
  if (pcVar2 < pcVar6 && sVar3 != 0) {
    do {
      pcVar5 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar6;
      *pcVar6 = cVar1;
      pcVar6 = pcVar6 + -1;
      pcVar2 = pcVar5;
    } while (pcVar5 < pcVar6);
  }
  pcVar2 = (number->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + number->_M_string_length);
  sliceString(__return_storage_ptr__,&local_68,0,uVar8 + (int)number->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string formatFloatNumber(string number) {
	assert(contain(number, '.'));
	int zeroPostfix = 0;
	reverse(number.begin(), number.end());
	for (int i = 0; i < number.size() - 1; ++i) {
		if (number[i] == '0' and number[i + 1] != '.') {
			++zeroPostfix;
		} else break;
	}
	reverse(number.begin(), number.end());
	return sliceString(number, 0, number.size() - zeroPostfix - 1);
}